

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
booster::locale::basic_format<wchar_t>::format_output
          (basic_format<wchar_t> *this,stream_type *out,string_type *sformat)

{
  pointer pwVar1;
  bool bVar2;
  uint uVar3;
  code *pcVar4;
  pointer pfVar5;
  ulong uVar6;
  long lVar7;
  void *pvVar8;
  wchar_t wVar9;
  ulong uVar10;
  undefined1 local_c0 [8];
  string_type value;
  string svalue;
  format_parser fmt;
  undefined1 local_70 [8];
  string key;
  undefined1 local_48 [8];
  format_guard guard;
  
  pwVar1 = (sformat->_M_dataplus)._M_p;
  key.field_2._8_8_ = sformat->_M_string_length;
  uVar6 = 0;
  guard._8_8_ = out;
  do {
    while (wVar9 = pwVar1[uVar6], wVar9 == L'{') {
      uVar10 = uVar6 + 1;
      if ((uVar10 < (ulong)key.field_2._8_8_) && (pwVar1[uVar6 + 1] == L'{')) {
        local_70._0_4_ = 0x7b;
LAB_00185784:
        std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
                  ((wostream *)guard._8_8_,(wchar_t *)local_70,1);
        uVar6 = uVar6 + 2;
      }
      else {
        booster::locale::details::format_parser::format_parser
                  ((format_parser *)(svalue.field_2._M_local_buf + 8),
                   (ios_base *)(*(long *)(*(long *)guard._8_8_ + -0x18) + guard._8_8_),
                   (void *)guard._8_8_,imbue_locale);
        guard.fmt_._0_1_ = '\0';
        local_48 = (undefined1  [8])(svalue.field_2._M_local_buf + 8);
        do {
          uVar6 = uVar10;
          if ((ulong)key.field_2._8_8_ <= uVar10) break;
          local_70 = (undefined1  [8])&key._M_string_length;
          key._M_dataplus._M_p = (pointer)0x0;
          key._M_string_length._0_1_ = 0;
          value.field_2._8_8_ = &svalue._M_string_length;
          svalue._M_dataplus._M_p = (pointer)0x0;
          svalue._M_string_length._0_1_ = 0;
          local_c0 = (undefined1  [8])&value._M_string_length;
          value._M_dataplus._M_p = (pointer)0x0;
          value._M_string_length._0_4_ = 0;
          while( true ) {
            wVar9 = pwVar1[uVar10];
            if ((((ulong)(uint)wVar9 < 0x3e) &&
                ((0x2000100000000001U >> ((ulong)(uint)wVar9 & 0x3f) & 1) != 0)) || (wVar9 == L'}'))
            break;
            std::__cxx11::string::push_back((char)(string *)local_70);
            uVar10 = uVar10 + 1;
          }
          bVar2 = true;
          if (pwVar1[uVar10] == L'=') {
            if (pwVar1[uVar10 + 1] == L'\'') {
              uVar10 = uVar10 + 2;
LAB_0018585f:
              wVar9 = (wchar_t)(basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                                *)local_c0;
              if (pwVar1[uVar10] != L'\'') {
                if (pwVar1[uVar10] == L'\0') goto LAB_001858c5;
                lVar7 = 1;
                std::__cxx11::wstring::push_back(wVar9);
LAB_00185896:
                uVar10 = uVar10 + lVar7;
                goto LAB_0018585f;
              }
              if (pwVar1[uVar10 + 1] == L'\'') {
                lVar7 = 2;
                std::__cxx11::wstring::push_back(wVar9);
                goto LAB_00185896;
              }
              uVar10 = uVar10 + 1;
LAB_001858c5:
              bVar2 = false;
            }
            else {
              while( true ) {
                uVar10 = uVar10 + 1;
                wVar9 = pwVar1[uVar10];
                if (((wVar9 == L'\0') || (wVar9 == L',')) || (wVar9 == L'}')) break;
                std::__cxx11::string::push_back((char)&value + '\x18');
              }
            }
          }
          if (bVar2) {
            booster::locale::details::format_parser::set_one_flag
                      ((string *)(svalue.field_2._M_local_buf + 8),(string *)local_70);
          }
          else {
            details::format_parser::set_flag_with_str<wchar_t>
                      ((format_parser *)(svalue.field_2._M_local_buf + 8),(string *)local_70,
                       (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *
                       )local_c0);
          }
          if (pwVar1[uVar10] == L'}') {
            uVar3 = booster::locale::details::format_parser::get_position();
            if (uVar3 < this->parameters_count_) {
              pfVar5 = (this->ext_params_).
                       super__Vector_base<booster::locale::details::formattible<wchar_t>,_std::allocator<booster::locale::details::formattible<wchar_t>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + (uVar3 - 8);
              if (uVar3 < 8) {
                pfVar5 = this->parameters_ + uVar3;
              }
              pvVar8 = pfVar5->pointer_;
              pcVar4 = pfVar5->writer_;
            }
            else {
              pcVar4 = details::formattible<wchar_t>::void_write;
              pvVar8 = (void *)0x0;
            }
            (*pcVar4)((stream_type *)guard._8_8_,pvVar8);
            if ((char)guard.fmt_ == '\0') {
              booster::locale::details::format_parser::restore();
              guard.fmt_._0_1_ = '\x01';
            }
            uVar10 = uVar10 + 1;
LAB_00185982:
            bVar2 = false;
          }
          else {
            if (pwVar1[uVar10] != L',') {
              if ((char)guard.fmt_ == '\0') {
                booster::locale::details::format_parser::restore();
                guard.fmt_._0_1_ = '\x01';
              }
              goto LAB_00185982;
            }
            uVar10 = uVar10 + 1;
            bVar2 = true;
          }
          if (local_c0 != (undefined1  [8])&value._M_string_length) {
            operator_delete((void *)local_c0);
          }
          if ((size_type *)value.field_2._8_8_ != &svalue._M_string_length) {
            operator_delete((void *)value.field_2._8_8_);
          }
          if (local_70 != (undefined1  [8])&key._M_string_length) {
            operator_delete((void *)local_70);
          }
          uVar6 = uVar10;
        } while (bVar2);
        format_guard::~format_guard((format_guard *)local_48);
        booster::locale::details::format_parser::~format_parser
                  ((format_parser *)(svalue.field_2._M_local_buf + 8));
      }
    }
    if (wVar9 == L'}') {
      if (pwVar1[uVar6 + 1] == L'}') {
        local_70._0_4_ = 0x7d;
        goto LAB_00185784;
      }
    }
    else if (wVar9 == L'\0') {
      return;
    }
    local_70._0_4_ = wVar9;
    std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
              ((wostream *)guard._8_8_,(wchar_t *)local_70,1);
    uVar6 = uVar6 + 1;
  } while( true );
}

Assistant:

void format_output(stream_type &out,string_type const &sformat) const
            {
                char_type obrk='{';
                char_type cbrk='}';
                char_type eq='=';
                char_type comma=',';
                char_type quote='\'';

                size_t pos = 0;
                size_t size=sformat.size();
                CharType const *format=sformat.c_str();
                while(format[pos]!=0) {
                    if(format[pos] != obrk) {
                        if(format[pos]==cbrk && format[pos+1]==cbrk) {
                            out << cbrk;
                            pos+=2;
                        }
                        else {
                            out<<format[pos];
                            pos++;
                        }
                        continue;
                    }

                    if(pos+1 < size && format[pos+1]==obrk) {
                        out << obrk;
                        pos+=2;
                        continue;
                    }
                    pos++;
                  
                    details::format_parser fmt(out,static_cast<void *>(&out),&basic_format::imbue_locale);

                    format_guard guard(fmt);

                    while(pos < size) { 
                        std::string key;
                        std::string svalue;
                        string_type value;
                        bool use_svalue = true;
                        for(;format[pos];pos++) {
                            char_type c=format[pos];
                            if(c==comma || c==eq || c==cbrk)
                                break;
                            else {
                                key+=static_cast<char>(c);
                            }
                        }

                        if(format[pos]==eq) {
                            pos++;
                            if(format[pos]==quote) {
                                pos++;
                                use_svalue = false;
                                while(format[pos]) {
                                    if(format[pos]==quote) {
                                        if(format[pos+1]==quote) {
                                            value+=quote;
                                            pos+=2;
                                        }
                                        else {
                                            pos++;
                                            break;
                                        }
                                    }
                                    else {
                                        value+=format[pos];
                                        pos++;
                                    }
                                }
                            }
                            else {
                                char_type c;
                                while((c=format[pos])!=0 && c!=comma && c!=cbrk) {
                                    svalue+=static_cast<char>(c);
                                    pos++;
                                }
                            }
                        }

                        if(use_svalue) {
                            fmt.set_one_flag(key,svalue);
                        }
                        else 
                            fmt.set_flag_with_str(key,value);
                        
                        if(format[pos]==comma) {
                            pos++;
                            continue;
                        }
                        else if(format[pos]==cbrk)  {
                            unsigned position = fmt.get_position();
                            out << get(position);
                            guard.restore();
                            pos++;
                            break;
                        }
                        else {                        
                            guard.restore();
                            break;
                        }
                    }
                }
            }